

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArticulatedBodyInertia.cpp
# Opt level: O0

ArticulatedBodyInertia *
iDynTree::ArticulatedBodyInertia::ABADyadHelperLin
          (SpatialForceVector *U,double inv_d,SpatialForceVector *param_3,double d_inv_d)

{
  VectorFixSize<3U> *pVVar1;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>_>
  *other;
  Stride<0,_0> *this;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *this_00;
  MatrixBase<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *other_00;
  long in_RSI;
  ArticulatedBodyInertia *in_RDI;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> dUang;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> dUlin;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> Uang;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> Ulin;
  ArticulatedBodyInertia *ret;
  ArticulatedBodyInertia *in_stack_fffffffffffff650;
  PointerArgType in_stack_fffffffffffff658;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>
  *in_stack_fffffffffffff660;
  ArticulatedBodyInertia *other_01;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>_>
  *in_stack_fffffffffffff678;
  StorageBaseType *in_stack_fffffffffffff690;
  double *in_stack_fffffffffffff698;
  
  other_01 = in_RDI;
  ArticulatedBodyInertia(in_stack_fffffffffffff650);
  pVVar1 = &SpatialVector<iDynTree::SpatialForceVector>::getLinearVec3
                      ((SpatialVector<iDynTree::SpatialForceVector> *)(in_RSI + 8))->super_Vector3;
  other = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>_>
           *)VectorFixSize<3U>::data(pVVar1);
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)in_stack_fffffffffffff650);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
             (Stride<0,_0> *)in_stack_fffffffffffff650);
  pVVar1 = &SpatialVector<iDynTree::SpatialForceVector>::getAngularVec3
                      ((SpatialVector<iDynTree::SpatialForceVector> *)(in_RSI + 8))->super_Vector3;
  this = (Stride<0,_0> *)VectorFixSize<3U>::data(pVVar1);
  Eigen::Stride<0,_0>::Stride(this);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (in_stack_fffffffffffff660,in_stack_fffffffffffff658,this);
  pVVar1 = &SpatialVector<iDynTree::SpatialForceVector>::getLinearVec3
                      ((SpatialVector<iDynTree::SpatialForceVector> *)(in_RSI + 8))->super_Vector3;
  this_00 = (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
             *)VectorFixSize<3U>::data(pVVar1);
  Eigen::Stride<0,_0>::Stride(this);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (in_stack_fffffffffffff660,(PointerArgType)this_00,this);
  pVVar1 = &SpatialVector<iDynTree::SpatialForceVector>::getAngularVec3
                      ((SpatialVector<iDynTree::SpatialForceVector> *)(in_RSI + 8))->super_Vector3;
  other_00 = (MatrixBase<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
              *)VectorFixSize<3U>::data(pVVar1);
  Eigen::Stride<0,_0>::Stride(this);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)other_00,
             (PointerArgType)this_00,this);
  Eigen::operator*(in_stack_fffffffffffff698,in_stack_fffffffffffff690);
  Eigen::DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  ::transpose(this_00);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)in_RDI,other_00);
  Eigen::operator*(in_stack_fffffffffffff698,in_stack_fffffffffffff690);
  Eigen::DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  ::transpose(this_00);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)in_RDI,other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>>
  ::operator+((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
               *)in_stack_fffffffffffff678,
              (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
               *)other_01);
  Eigen::operator*(in_stack_fffffffffffff698,in_stack_fffffffffffff690);
  Eigen::DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  ::transpose(this_00);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)in_RDI,other_00);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>const>>
  ::operator+(in_stack_fffffffffffff678,
              (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
               *)other_01);
  getLinearLinearSubmatrix(in_RDI);
  toEigen<3u,3u>(&in_RDI->linearLinear);
  Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)this,other);
  Eigen::operator*(in_stack_fffffffffffff698,in_stack_fffffffffffff690);
  Eigen::DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  ::transpose(this_00);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)in_RDI,other_00);
  Eigen::operator*(in_stack_fffffffffffff698,in_stack_fffffffffffff690);
  Eigen::DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  ::transpose(this_00);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)in_RDI,other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>>
  ::operator+((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
               *)in_stack_fffffffffffff678,
              (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
               *)other_01);
  Eigen::operator*(in_stack_fffffffffffff698,in_stack_fffffffffffff690);
  Eigen::DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  ::transpose(this_00);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)in_RDI,other_00);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>const>>
  ::operator+(in_stack_fffffffffffff678,
              (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
               *)other_01);
  getLinearAngularSubmatrix(in_RDI);
  toEigen<3u,3u>(&in_RDI->linearLinear);
  Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)this,other);
  Eigen::operator*(in_stack_fffffffffffff698,in_stack_fffffffffffff690);
  Eigen::DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  ::transpose(this_00);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)in_RDI,other_00);
  Eigen::operator*(in_stack_fffffffffffff698,in_stack_fffffffffffff690);
  Eigen::DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  ::transpose(this_00);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)in_RDI,other_00);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>>
  ::operator+((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
               *)in_stack_fffffffffffff678,
              (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
               *)other_01);
  Eigen::operator*(in_stack_fffffffffffff698,in_stack_fffffffffffff690);
  Eigen::DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  ::transpose(this_00);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)in_RDI,other_00);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>const>>
  ::operator+(in_stack_fffffffffffff678,
              (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
               *)other_01);
  getAngularAngularSubmatrix(in_RDI);
  toEigen<3u,3u>(&in_RDI->linearLinear);
  Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)this,other);
  return other_01;
}

Assistant:

ArticulatedBodyInertia ArticulatedBodyInertia::ABADyadHelperLin(const SpatialForceVector& U, const double inv_d,
                                                                const SpatialForceVector& /*dU*/, const double d_inv_d)
{
    ArticulatedBodyInertia ret;

    Eigen::Map<const Eigen::Vector3d> Ulin(U.getLinearVec3().data());
    Eigen::Map<const Eigen::Vector3d> Uang(U.getAngularVec3().data());

    Eigen::Map<const Eigen::Vector3d> dUlin(U.getLinearVec3().data());
    Eigen::Map<const Eigen::Vector3d> dUang(U.getAngularVec3().data());

    toEigen(ret.getLinearLinearSubmatrix()) =   (d_inv_d*Ulin)*Ulin.transpose()
                                              + (inv_d*dUlin)*Ulin.transpose()
                                              + (inv_d*Ulin)*dUlin.transpose();
    toEigen(ret.getLinearAngularSubmatrix()) =  (d_inv_d*Ulin)*Uang.transpose()
                                              + (inv_d*dUlin)*Uang.transpose()
                                              + (inv_d*Ulin)*dUang.transpose();
    toEigen(ret.getAngularAngularSubmatrix()) = (d_inv_d*Uang)*Uang.transpose()
                                              + (inv_d*dUang)*Uang.transpose()
                                              + (inv_d*Uang)*dUang.transpose();

    return ret;
}